

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall
fmp4_stream::ingest_stream::patch_tfdt
          (ingest_stream *this,uint64_t time_anchor,bool applytimescale,uint32_t anchor_scale)

{
  uint32_t uVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_2c;
  int local_28;
  uint32_t i;
  uint32_t seq_nr;
  uint32_t timescale;
  uint32_t anchor_scale_local;
  bool applytimescale_local;
  uint64_t time_anchor_local;
  ingest_stream *this_local;
  
  _anchor_scale_local = time_anchor;
  if ((applytimescale) && (uVar1 = init_fragment::get_time_scale(&this->init_fragment_), uVar1 != 0)
     ) {
    _anchor_scale_local = (time_anchor * uVar1) / (ulong)anchor_scale;
  }
  local_28 = 0;
  sVar2 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
          size(&this->media_fragment_);
  if ((sVar2 != 0) && (!applytimescale)) {
    sVar2 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
            size(&this->media_fragment_);
    pvVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,sVar2 - 1);
    local_28 = *(int *)&(pvVar3->mfhd_).super_full_box.field_0x6c + 1;
  }
  for (local_2c = 0;
      sVar2 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
              ::size(&this->media_fragment_), local_2c < sVar2; local_2c = local_2c + 1) {
    pvVar3 = std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ::operator[](&this->media_fragment_,(ulong)local_2c);
    media_fragment::patch_tfdt(pvVar3,_anchor_scale_local,local_28 + local_2c);
  }
  return;
}

Assistant:

void ingest_stream::patch_tfdt(uint64_t time_anchor, bool applytimescale, uint32_t anchor_scale)
	{
		if (applytimescale) {
			uint32_t timescale = 0;
			timescale = this->init_fragment_.get_time_scale();
			if(timescale)
			   time_anchor = time_anchor * timescale / anchor_scale; // offset to add to the timestamps
		}

		uint32_t seq_nr = 0;
		
		// only patch sequence number in the case when no timescale is applied 
		if (media_fragment_.size() && !applytimescale)
			seq_nr = 1 + this->media_fragment_[media_fragment_.size()-1].mfhd_.seq_nr_;

		for (uint32_t i = 0; i < this->media_fragment_.size(); i++)
		{
				this->media_fragment_[i].patch_tfdt(time_anchor, seq_nr + i);
		}	
	}